

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disjunctiveMonotone.c
# Opt level: O1

void printAllIntVectors(Vec_Ptr_t *vDisjunctions,Abc_Ntk_t *pNtk,char *fileName)

{
  int iVar1;
  void *pvVar2;
  FILE *__s;
  char *pcVar3;
  size_t __size;
  long lVar4;
  long lVar5;
  
  __s = fopen(fileName,"a");
  if (0 < vDisjunctions->nSize) {
    lVar5 = 0;
    do {
      pvVar2 = vDisjunctions->pArray[lVar5];
      fwrite("( ",2,1,__s);
      if (0 < *(int *)((long)pvVar2 + 4)) {
        lVar4 = 0;
        do {
          iVar1 = *(int *)(*(long *)((long)pvVar2 + 8) + lVar4 * 4);
          if (((long)iVar1 < 0) || (pNtk->vPos->nSize <= iVar1)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          pcVar3 = Abc_ObjName((Abc_Obj_t *)pNtk->vPos->pArray[iVar1]);
          pcVar3 = strstr(pcVar3,"hint");
          if (pcVar3 == (char *)0x0) {
            __assert_fail("hintSubStr",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/live/disjunctiveMonotone.c"
                          ,0x202,"void printAllIntVectors(Vec_Ptr_t *, Abc_Ntk_t *, char *)");
          }
          fputs(pcVar3,__s);
          if (lVar4 < (long)*(int *)((long)pvVar2 + 4) + -1) {
            __size = 4;
            pcVar3 = " || ";
          }
          else {
            __size = 3;
            pcVar3 = " )\n";
          }
          fwrite(pcVar3,__size,1,__s);
          lVar4 = lVar4 + 1;
        } while (lVar4 < *(int *)((long)pvVar2 + 4));
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < vDisjunctions->nSize);
  }
  fclose(__s);
  return;
}

Assistant:

void printAllIntVectors(Vec_Ptr_t *vDisjunctions, Abc_Ntk_t *pNtk, char *fileName)
{
    Vec_Int_t *vElem;
    int i, j, iElem;
    char *name, *hintSubStr;
    FILE *fp;

    fp = fopen( fileName, "a" );

    Vec_PtrForEachEntry(Vec_Int_t *, vDisjunctions, vElem, i)
    {    
        fprintf(fp, "( ");
        Vec_IntForEachEntry( vElem, iElem, j )
        {
            name = Abc_ObjName( Abc_NtkPo(pNtk, iElem));
            hintSubStr = strstr( name, "hint");
            assert( hintSubStr );
            fprintf(fp, "%s", hintSubStr);
            if( j < Vec_IntSize(vElem) - 1 )
            {
                fprintf(fp, " || ");
            }
            else
            {
                fprintf(fp, " )\n");
            }
        }
    }
    fclose(fp);
}